

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::HasWalletSpend(CWallet *this,CTransactionRef *tx)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  COutPoint local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar6 = (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (bVar6) {
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    local_68.n = 0;
    bVar3 = IsSpent(this,&local_68);
    if (!bVar3) {
      uVar5 = 1;
      do {
        peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        uVar4 = ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        bVar3 = uVar4 - uVar5 == 0;
        bVar6 = uVar4 >= uVar5 && !bVar3;
        if (uVar4 < uVar5 || bVar3) break;
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)
              ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)
              ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)
              ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_68.n = (uint32_t)uVar5;
        bVar3 = IsSpent(this,&local_68);
        uVar5 = (ulong)((uint32_t)uVar5 + 1);
      } while (!bVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::HasWalletSpend(const CTransactionRef& tx) const
{
    AssertLockHeld(cs_wallet);
    const Txid& txid = tx->GetHash();
    for (unsigned int i = 0; i < tx->vout.size(); ++i) {
        if (IsSpent(COutPoint(txid, i))) {
            return true;
        }
    }
    return false;
}